

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_logger.cpp
# Opt level: O2

void __thiscall
cppnet::BaseLogger::BaseLogger(BaseLogger *this,uint16_t cache_size,uint16_t block_size)

{
  __shared_ptr<cppnet::NormalAlloter,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  this->_level = 0xf;
  this->_cache_size = cache_size;
  this->_block_size = block_size;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_allocter).super___shared_ptr<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ThreadSafeQueue<cppnet::Log_*>::ThreadSafeQueue(&this->_cache_queue);
  (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->_logger).super___shared_ptr<cppnet::Logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  MakeNormalAlloterPtr();
  std::__shared_ptr<cppnet::Alloter,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cppnet::Alloter,(__gnu_cxx::_Lock_policy)2> *)&this->_allocter,&local_20)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

BaseLogger::BaseLogger(uint16_t cache_size, uint16_t block_size):
    _level(LL_INFO),
    _cache_size(cache_size),
    _block_size(block_size) {

    _allocter = MakeNormalAlloterPtr();
}